

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chset.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
test<mpl_::bool_<false>>
          (compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,byte ch,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
  cVar1;
  bool bVar2;
  compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
  cVar3;
  
  cVar1 = this[0x20];
  bVar2 = std::bitset<256UL>::test((bitset<256UL> *)this,(ulong)ch);
  if (bVar2) {
    cVar3 = (compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
             )0x1;
  }
  else {
    cVar3 = (compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
             )0x0;
    if (this[0x21] ==
        (compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
         )0x1) {
      cVar3 = (compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
               )compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                ::test_posix((compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                              *)this,ch,tr);
    }
  }
  return cVar3 != cVar1;
}

Assistant:

bool test(char_type ch, Traits const &tr, ICase) const
    {
        return this->complement_ !=
            (this->base_type::test(ch, tr, ICase()) ||
            (this->has_posix_ && this->test_posix(ch, tr)));
    }